

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecursiveDescentParser.cpp
# Opt level: O1

shared_ptr<MyCompiler::ConstDeclaration> __thiscall
MyCompiler::RecursiveDescentParser::parse<MyCompiler::ConstDeclaration>
          (RecursiveDescentParser *this)

{
  istream *piVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  RecursiveDescentParser *in_RSI;
  shared_ptr<MyCompiler::ConstDeclaration> sVar3;
  string local_50;
  
  this->stream = (istream *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<MyCompiler::ConstDeclaration,std::allocator<MyCompiler::ConstDeclaration>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->currentToken,
             (ConstDeclaration **)this,(allocator<MyCompiler::ConstDeclaration> *)&local_50);
  if (in_RSI->sym == CONST) {
    nextSym(in_RSI);
  }
  while( true ) {
    piVar1 = this->stream;
    parse<MyCompiler::ConstDefinition>((RecursiveDescentParser *)&local_50);
    std::vector<MyCompiler::ConstDefinition,_std::allocator<MyCompiler::ConstDefinition>_>::
    push_back((vector<MyCompiler::ConstDefinition,_std::allocator<MyCompiler::ConstDefinition>_> *)
              (piVar1 + 0x48),(value_type *)local_50._M_dataplus._M_p);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_string_length);
    }
    if (in_RSI->sym != COMMA) break;
    nextSym(in_RSI);
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"semicolon or comma expected","");
  except(in_RSI,SEMICOLON,&local_50);
  _Var2._M_pi = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,(ulong)(local_50.field_2._M_allocated_capacity + 1));
    _Var2._M_pi = extraout_RDX_00;
  }
  sVar3.super___shared_ptr<MyCompiler::ConstDeclaration,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var2._M_pi;
  sVar3.super___shared_ptr<MyCompiler::ConstDeclaration,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<MyCompiler::ConstDeclaration>)
         sVar3.super___shared_ptr<MyCompiler::ConstDeclaration,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MyCompiler::ConstDeclaration> MyCompiler::RecursiveDescentParser::parse()
{
    auto pResult = std::make_shared<ConstDeclaration>();

    accept(SymbolType::CONST);
    do
        pResult->vConstDefinition.push_back(*parse<ConstDefinition>());
    while (accept(SymbolType::COMMA));
    except(SymbolType::SEMICOLON, "semicolon or comma expected");

    return pResult;
}